

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyPointer
               (ResultCollector *result,QueriedState *state,void *expected)

{
  DataType DVar1;
  void **ppvVar2;
  ostream *poVar3;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  void *expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  buf._368_8_ = expected;
  DVar1 = QueriedState::getType(state);
  if ((DVar1 == DATATYPE_POINTER) &&
     (ppvVar2 = QueriedState::getPtrAccess(state), *ppvVar2 != (void *)buf._368_8_)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Expected ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(void *)buf._368_8_);
    poVar3 = std::operator<<(poVar3,", got ");
    ppvVar2 = QueriedState::getPtrAccess(state);
    std::ostream::operator<<(poVar3,*ppvVar2);
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void verifyPointer (tcu::ResultCollector& result, QueriedState& state, const void* expected)
{
	switch (state.getType())
	{
		case DATATYPE_POINTER:
		{
			if (state.getPtrAccess() != expected)
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << state.getPtrAccess();
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}